

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_coletree.c
# Opt level: O1

int * TreePostorder(int n,int *parent)

{
  int iVar1;
  int *__s;
  int *addr;
  int *piVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  
  iVar1 = n + 1;
  __s = mxCallocInt(iVar1);
  addr = mxCallocInt(iVar1);
  piVar2 = mxCallocInt(iVar1);
  if (-1 < n) {
    memset(__s,0xff,(ulong)(uint)n * 4 + 4);
  }
  uVar5 = (ulong)(uint)n;
  if (0 < n) {
    do {
      iVar1 = parent[uVar5 - 1];
      addr[uVar5 - 1] = __s[iVar1];
      __s[iVar1] = (int)(uVar5 - 1);
      bVar6 = 1 < (long)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar6);
  }
  if (n != 0) {
    iVar1 = 0;
    uVar5 = (ulong)(uint)n;
    do {
      iVar4 = (int)uVar5;
      uVar3 = __s[iVar4];
      if (uVar3 == 0xffffffff) {
        piVar2[iVar4] = iVar1;
        uVar3 = addr[iVar4];
        while (uVar3 == 0xffffffff) {
          iVar1 = iVar1 + 1;
          uVar5 = (ulong)parent[(int)uVar5];
          piVar2[uVar5] = iVar1;
          uVar3 = addr[uVar5];
        }
        bVar6 = iVar1 == n;
        iVar1 = iVar1 + 1;
        if (bVar6) break;
      }
      uVar5 = (ulong)uVar3;
    } while (iVar1 != n);
  }
  superlu_free(__s);
  superlu_free(addr);
  return piVar2;
}

Assistant:

int *TreePostorder(
		   int n,
		   int *parent
		   )
{
        int	*first_kid, *next_kid;	/* Linked list of children.	*/
        int	*post, postnum;
	int	v, dad;

	/* Allocate storage for working arrays and results	*/
	first_kid = 	mxCallocInt (n+1);
	next_kid  = 	mxCallocInt (n+1);
	post	  = 	mxCallocInt (n+1);

	/* Set up structure describing children */
	for (v = 0; v <= n; first_kid[v++] = -1);
	for (v = n-1; v >= 0; v--) {
		dad = parent[v];
		next_kid[v] = first_kid[dad];
		first_kid[dad] = v;
	}

	/* Depth-first search from dummy root vertex #n */
	postnum = 0;
#if 0
	/* recursion */
	etdfs (n, first_kid, next_kid, post, &postnum);
#else
	/* no recursion */
	nr_etdfs(n, parent, first_kid, next_kid, post, postnum);
#endif

	SUPERLU_FREE (first_kid);
	SUPERLU_FREE (next_kid);
	return post;
}